

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformationImplementation::GetModelName_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(this->ChipID).ModelName)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::GetModelName()
{
  return this->ChipID.ModelName;
}